

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

void __thiscall hanabi_learning_env::HanabiState::ApplyRandomChance(HanabiState *this)

{
  bool bVar1;
  HanabiGame *this_00;
  HanabiState *in_RDI;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  *unaff_retaddr;
  HanabiGame *in_stack_00000008;
  HanabiState *in_stack_00000018;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  chance_outcomes;
  HanabiState *in_stack_000000e8;
  HanabiMove in_stack_000000f0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  
  ChanceOutcomes(in_stack_00000018);
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffb0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!chance_outcomes.second.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                  ,0x11c,"void hanabi_learning_env::HanabiState::ApplyRandomChance()");
  }
  this_00 = ParentGame(in_RDI);
  HanabiGame::PickRandomChance(in_stack_00000008,unaff_retaddr);
  ApplyMove(in_stack_000000e8,in_stack_000000f0);
  std::
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~pair((pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
           *)this_00);
  return;
}

Assistant:

void HanabiState::ApplyRandomChance() {
  auto chance_outcomes = ChanceOutcomes();
  REQUIRE(!chance_outcomes.second.empty());
  ApplyMove(ParentGame()->PickRandomChance(chance_outcomes));
}